

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsteps.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (argc < 3) {
    puts(
        "Generate steps:\n\n a2->      +-------+\n           |       |\n a1-> -----+       |\n a3->              +----\n      <-n1-><--n2-><-n3>\n\ngiven in command lines as: a1 n1 a2 n2 a3 n3"
        );
    iVar1 = 1;
  }
  else {
    lVar2 = 2;
    lVar3 = 1;
    do {
      __s = argv[lVar3];
      iVar1 = atoi(argv[lVar2]);
      if (0 < iVar1) {
        do {
          puts(__s);
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      iVar1 = (int)lVar3;
      lVar2 = lVar2 + 2;
      lVar3 = lVar3 + 2;
    } while (iVar1 + 3 < argc);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main (int argc, char* argv[])
{
    if(argc < 3) {
	printf("Generate steps:\n"\
	       "\n"\
	       " a2->      +-------+\n"\
	       "           |       |\n"\
	       " a1-> -----+       |\n"\
	       " a3->              +----\n"\
	       "      <-n1-><--n2-><-n3>\n"\
	       "\n"\
	       "given in command lines as: a1 n1 a2 n2 a3 n3\n");
	return 1;
    }
    for(int i = 1; i+1 < argc; i += 2) {
	char	*a = argv[i];
	int	n = atoi(argv[i+1]);
	for(int j = 0; j < n; ++j) {
	    printf("%s\n", a);
	}
    }
    return 0;
}